

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O3

_Bool ckh_try_insert(ckh_t *ckh,void **argkey,void **argdata)

{
  ckhc_t *pcVar1;
  void *key;
  void *data;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  ulong bucket;
  ulong bucket_00;
  void *pvVar6;
  bool bVar7;
  size_t hashes [2];
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  
  pvVar5 = *argkey;
  pvVar6 = *argdata;
  (*ckh->hash)(pvVar5,&local_48);
  _Var2 = ckh_try_bucket_insert
                    (ckh,~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & local_48,pvVar5,pvVar6);
  if (_Var2) {
    bucket_00 = ~(-1L << ((byte)ckh->lg_curbuckets & 0x3f)) & local_40;
    _Var2 = ckh_try_bucket_insert(ckh,bucket_00,pvVar5,pvVar6);
    if (_Var2) {
      pvVar5 = *argdata;
      bucket = bucket_00;
      pvVar6 = *argkey;
      while( true ) {
        uVar4 = ckh->prng_state * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        ckh->prng_state = uVar4;
        pcVar1 = ckh->tab;
        uVar4 = uVar4 >> 0x3e | bucket << 2;
        key = pcVar1[uVar4].key;
        data = pcVar1[uVar4].data;
        pcVar1[uVar4].key = pvVar6;
        pcVar1[uVar4].data = pvVar5;
        (*ckh->hash)(key,&local_58);
        uVar4 = ~(-1L << ((byte)ckh->lg_curbuckets & 0x3f));
        uVar3 = local_50 & uVar4;
        bVar7 = uVar3 != bucket;
        bucket = uVar4 & local_58;
        if (bVar7) {
          bucket = uVar3;
        }
        bVar7 = bucket == bucket_00;
        if (bVar7) break;
        _Var2 = ckh_try_bucket_insert(ckh,bucket,key,data);
        pvVar5 = data;
        pvVar6 = key;
        if (!_Var2) {
          return bVar7;
        }
      }
      *argkey = key;
      *argdata = data;
      return bVar7;
    }
  }
  return false;
}

Assistant:

static bool
ckh_try_insert(ckh_t *ckh, void const**argkey, void const**argdata) {
	size_t hashes[2], bucket;
	const void *key = *argkey;
	const void *data = *argdata;

	ckh->hash(key, hashes);

	/* Try to insert in primary bucket. */
	bucket = hashes[0] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	if (!ckh_try_bucket_insert(ckh, bucket, key, data)) {
		return false;
	}

	/* Try to insert in secondary bucket. */
	bucket = hashes[1] & ((ZU(1) << ckh->lg_curbuckets) - 1);
	if (!ckh_try_bucket_insert(ckh, bucket, key, data)) {
		return false;
	}

	/*
	 * Try to find a place for this item via iterative eviction/relocation.
	 */
	return ckh_evict_reloc_insert(ckh, bucket, argkey, argdata);
}